

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool Am_Handle_Placeholders_And_Call_Command
               (int cnt,Am_Object *cmd,Am_Selective_Allowed_Method *same_allowed_method,
               Am_Handler_Selective_Undo_Method *same_method,
               Am_Selective_New_Allowed_Method *new_allowed_method,
               Am_Handler_Selective_Repeat_New_Method *new_method,Am_Object *sel_widget,
               Am_Object *undo_handler,Am_Object *new_cmd)

{
  Am_Selective_New_Allowed_Method_Type *pAVar1;
  Am_Handler_Selective_Repeat_New_Method_Type *pAVar2;
  Am_Selective_Allowed_Method_Type *pAVar3;
  Am_Handler_Selective_Undo_Method_Type *pAVar4;
  bool bVar5;
  ostream *poVar6;
  Am_Value *this;
  Am_Value *pAVar7;
  Am_Object *this_00;
  anon_union_8_8_ea4c8939_for_value new_value_00;
  Am_Value AVar8;
  Am_Value AVar9;
  Am_Value AVar10;
  Am_Value AVar11;
  bool replaced_obj_mod;
  bool replaced_value;
  bool replaced_create;
  Am_Value new_obj_mod;
  Am_Object local_618;
  Am_Value new_value;
  Am_String s;
  Am_Object local_5f8;
  Am_Object local_5f0;
  Am_Object local_5e8;
  Am_Object local_5e0;
  Am_Object local_5d8;
  Am_Object local_5d0;
  Am_Object local_5c8;
  Am_Object local_5c0;
  Am_Object local_5b8;
  Am_Handler_Selective_Repeat_New_Method *local_5b0;
  Am_Value orig_obj_modified;
  Am_Value orig_value;
  Am_Value local_580;
  Am_Value local_570;
  Am_Value local_560;
  Am_Value local_550;
  ostrstream oss_1;
  char line_1 [250];
  ostrstream oss;
  char line [300];
  
  Am_Beep_Happened = false;
  local_5b0 = new_method;
  std::ostrstream::ostrstream(&oss,line,300,_S_out);
  reset_ostrstream(&oss);
  Am_Object::Am_Object(&local_5b8,cmd);
  am_write_command_name(&local_5b8,cnt,&oss);
  Am_Object::~Am_Object(&local_5b8);
  if (am_sdebug == true) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Doing cmd: ");
    poVar6 = std::operator<<(poVar6,line);
    poVar6 = std::operator<<(poVar6," || ");
    poVar6 = operator<<(poVar6,cmd);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
  }
  orig_obj_modified.type = 0;
  orig_obj_modified.value.wrapper_value = (Am_Wrapper *)0x0;
  orig_value.type = 0;
  orig_value.value.wrapper_value = (Am_Wrapper *)0x0;
  new_obj_mod.type = 0;
  replaced_obj_mod = false;
  new_obj_mod.value.wrapper_value = (Am_Wrapper *)0x0;
  replaced_create = false;
  new_value.type = 0;
  replaced_value = false;
  new_value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Am_Object(&local_5c0,&Am_Object_Create_Command);
  bVar5 = Am_Object::Is_Instance_Of(cmd,&local_5c0);
  Am_Object::~Am_Object(&local_5c0);
  if (bVar5) {
LAB_001f9728:
    Am_Object::Am_Object(&local_618,&Am_Object_Create_Command);
    bVar5 = Am_Object::Is_Instance_Of(cmd,&local_618);
    if (bVar5) {
      Am_Object::~Am_Object(&local_618);
LAB_001f9794:
      pAVar7 = &new_obj_mod;
      new_value_00.wrapper_value = (Am_Wrapper *)&new_value;
      bVar5 = Am_Replace_Create_Placeholders
                        (cmd,&replaced_create,sel_widget,pAVar7,
                         (Am_Value *)new_value_00.wrapper_value);
    }
    else {
      Am_Object::Am_Object(&local_5c8,&Am_Find_Command);
      bVar5 = Am_Object::Is_Instance_Of(cmd,&local_5c8);
      Am_Object::~Am_Object(&local_5c8);
      Am_Object::~Am_Object(&local_618);
      if (bVar5) goto LAB_001f9794;
      bVar5 = Am_Replace_Placeholders
                        (cmd,0x16d,&replaced_obj_mod,&orig_obj_modified,&new_obj_mod,sel_widget);
      if (!bVar5) goto LAB_001f9d44;
      pAVar7 = &orig_value;
      new_value_00.wrapper_value = (Am_Wrapper *)&new_value;
      new_method = (Am_Handler_Selective_Repeat_New_Method *)sel_widget;
      bVar5 = Am_Replace_Placeholders
                        (cmd,0x169,&replaced_value,pAVar7,(Am_Value *)new_value_00.wrapper_value,
                         sel_widget);
    }
    if (bVar5 != false) {
      if (am_sdebug == true) {
        poVar6 = std::operator<<((ostream *)&std::cout,"%% Going to call method on cmd ");
        poVar6 = operator<<(poVar6,cmd);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::ostream::flush();
      }
      this = Am_Object::Get(cmd,0xef,1);
      bVar5 = Am_Value::Valid(this);
      if (((replaced_obj_mod != false) || (replaced_value != false)) ||
         (bVar5 || (replaced_create & 1U) != 0)) {
        pAVar1 = new_allowed_method->Call;
        Am_Object::Am_Object(&local_5d0,cmd);
        Am_Value::Am_Value(&local_550,&new_obj_mod);
        Am_Value::Am_Value(&local_560,&new_value);
        AVar8.value.wrapper_value = (Am_Wrapper *)&local_560;
        AVar8._0_8_ = &local_550;
        AVar9.value.wrapper_value = new_value_00.wrapper_value;
        AVar9._0_8_ = pAVar7;
        bVar5 = (*pAVar1)((Am_Object_Data *)&local_5d0,AVar8,AVar9);
        Am_Value::~Am_Value(&local_560);
        Am_Value::~Am_Value(&local_550);
        Am_Object::~Am_Object(&local_5d0);
        if (!bVar5) {
          std::ostrstream::ostrstream(&oss_1,line_1,0xfa,_S_out);
          poVar6 = std::operator<<((ostream *)&oss_1,"Can\'t execute command ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,cnt);
          poVar6 = std::operator<<(poVar6,". ");
          pAVar7 = Am_Object::Get(cmd,0x150,0);
          poVar6 = operator<<(poVar6,pAVar7);
          poVar6 = std::operator<<(poVar6," on NEW objects  ");
          poVar6 = operator<<(poVar6,&new_obj_mod);
          poVar6 = std::operator<<(poVar6," with new value ");
          poVar6 = operator<<(poVar6,&new_value);
          poVar6 = std::operator<<(poVar6,"; command object ");
          poVar6 = operator<<(poVar6,cmd);
          std::ends<char,std::char_traits<char>>(poVar6);
          Am_Pop_Up_Error_Window(line_1);
LAB_001f9d37:
          std::ostrstream::~ostrstream(&oss_1);
          goto LAB_001f9d44;
        }
        if (am_sdebug == true) {
          poVar6 = std::operator<<((ostream *)&std::cout,"%% ");
          poVar6 = operator<<(poVar6,local_5b0);
          poVar6 = std::operator<<(poVar6," on ");
          poVar6 = operator<<(poVar6,cmd);
          poVar6 = std::operator<<(poVar6," new_obj ");
          poVar6 = operator<<(poVar6,&new_obj_mod);
          poVar6 = std::operator<<(poVar6," val ");
          poVar6 = operator<<(poVar6,&new_value);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::ostream::flush();
        }
        pAVar2 = local_5b0->Call;
        Am_Object::Am_Object(&local_5d8,undo_handler);
        Am_Object::Am_Object(&local_5e0,cmd);
        Am_Value::Am_Value(&local_570,&new_obj_mod);
        Am_Value::Am_Value(&local_580,&new_value);
        AVar10.value.wrapper_value = (Am_Wrapper *)&local_570;
        AVar10._0_8_ = &local_5e0;
        AVar11.value = (anon_union_8_8_ea4c8939_for_value)
                       (anon_union_8_8_ea4c8939_for_value)new_method;
        AVar11._0_8_ = &local_580;
        (*pAVar2)((Am_Object_Data *)&oss_1,(Am_Object_Data *)&local_5d8,AVar10,AVar11);
        Am_Object::operator=(new_cmd,(Am_Object *)&oss_1);
        Am_Object::~Am_Object((Am_Object *)&oss_1);
        Am_Value::~Am_Value(&local_580);
        Am_Value::~Am_Value(&local_570);
        Am_Object::~Am_Object(&local_5e0);
        this_00 = &local_5d8;
      }
      else {
        pAVar3 = same_allowed_method->Call;
        Am_Object::Am_Object(&local_5e8,cmd);
        bVar5 = (*pAVar3)((Am_Object_Data *)&local_5e8);
        Am_Object::~Am_Object(&local_5e8);
        if (!bVar5) {
          std::ostrstream::ostrstream(&oss_1,line_1,0xfa,_S_out);
          poVar6 = std::operator<<((ostream *)&oss_1,"Can\'t execute command ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,cnt);
          poVar6 = std::operator<<(poVar6,". ");
          pAVar7 = Am_Object::Get(cmd,0x150,0);
          poVar6 = operator<<(poVar6,pAVar7);
          poVar6 = std::operator<<(poVar6," on SAME; command object ");
          poVar6 = operator<<(poVar6,cmd);
          std::ends<char,std::char_traits<char>>(poVar6);
          Am_Pop_Up_Error_Window(line_1);
          goto LAB_001f9d37;
        }
        pAVar4 = same_method->Call;
        Am_Object::Am_Object(&local_5f0,undo_handler);
        Am_Object::Am_Object(&local_5f8,cmd);
        (*pAVar4)((Am_Object_Data *)&oss_1,(Am_Object_Data *)&local_5f0);
        Am_Object::operator=(new_cmd,(Am_Object *)&oss_1);
        Am_Object::~Am_Object((Am_Object *)&oss_1);
        Am_Object::~Am_Object(&local_5f8);
        this_00 = &local_5f0;
      }
      Am_Object::~Am_Object(this_00);
      bVar5 = find_objects_for_placeholders
                        (Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,cmd,new_cmd,sel_widget);
      if (bVar5) {
        bVar5 = true;
        if (Am_Beep_Happened != true) goto LAB_001f9d46;
        am_gen_command_label((Am_Object *)&s);
        std::ostrstream::ostrstream(&oss_1,line_1,0xfa,_S_out);
        poVar6 = std::operator<<((ostream *)&oss_1,"Quitting due to Beep from command ");
        poVar6 = operator<<(poVar6,&s);
        poVar6 = std::operator<<(poVar6,"; command object ");
        poVar6 = operator<<(poVar6,cmd);
        std::ends<char,std::char_traits<char>>(poVar6);
        Am_Pop_Up_Error_Window(line_1);
        std::ostrstream::~ostrstream(&oss_1);
        Am_String::~Am_String(&s);
      }
    }
  }
  else {
    new_method = (Am_Handler_Selective_Repeat_New_Method *)sel_widget;
    bVar5 = Am_Replace_Placeholders
                      (cmd,0x16d,&replaced_obj_mod,&orig_obj_modified,&new_obj_mod,sel_widget);
    if (bVar5) goto LAB_001f9728;
  }
LAB_001f9d44:
  bVar5 = false;
LAB_001f9d46:
  Am_Value::~Am_Value(&new_value);
  Am_Value::~Am_Value(&new_obj_mod);
  Am_Value::~Am_Value(&orig_value);
  Am_Value::~Am_Value(&orig_obj_modified);
  std::ostrstream::~ostrstream(&oss);
  return bVar5;
}

Assistant:

bool
Am_Handle_Placeholders_And_Call_Command(
    int cnt, Am_Object &cmd, Am_Selective_Allowed_Method &same_allowed_method,
    Am_Handler_Selective_Undo_Method &same_method,
    Am_Selective_New_Allowed_Method &new_allowed_method,
    Am_Handler_Selective_Repeat_New_Method &new_method, Am_Object &sel_widget,
    Am_Object &undo_handler, Am_Object &new_cmd)
{
  char line[300];

  Am_Beep_Happened = false; //global in opal_advanced.h

  OSTRSTREAM_CONSTR(oss, line, 300, std::ios::out);
  reset_ostrstream(oss); // go to the beginning
  am_write_command_name(cmd, cnt, oss);
  OSTRSTREAM_COPY(oss, line, 300);
  if (am_sdebug)
    std::cout << "Doing cmd: " << line << " || " << cmd << std::endl
              << std::flush;

  bool replaced_obj_mod = false;
  bool replaced_create = false;
  bool replaced_value = false;
  Am_Value orig_obj_modified, orig_value, new_obj_mod, new_value;
  bool ok;

  if (!cmd.Is_Instance_Of(Am_Object_Create_Command)) {
    ok = Am_Replace_Placeholders(cmd, Am_OBJECT_MODIFIED, replaced_obj_mod,
                                 orig_obj_modified, new_obj_mod, sel_widget);
    if (!ok)
      return false;
  }
  if (cmd.Is_Instance_Of(Am_Object_Create_Command) ||
      cmd.Is_Instance_Of(Am_Find_Command)) {
    ok = Am_Replace_Create_Placeholders(cmd, replaced_create, sel_widget,
                                        new_obj_mod, new_value);
    if (!ok) {
      return false;
    }
  } else {
    ok = Am_Replace_Placeholders(cmd, Am_OBJECT_MODIFIED, replaced_obj_mod,
                                 orig_obj_modified, new_obj_mod, sel_widget);
    if (!ok)
      return false;
    ok = Am_Replace_Placeholders(cmd, Am_VALUE, replaced_value, orig_value,
                                 new_value, sel_widget);
    if (!ok) {
      return false;
    }
  }

  if (am_sdebug)
    std::cout << "%% Going to call method on cmd " << cmd << std::endl
              << std::flush;

  bool selectdir = cmd.Peek(Am_CURRENT_DIRECTION).Valid(); //HACK

  if (replaced_obj_mod || replaced_value || replaced_create || selectdir) {
    if (!new_allowed_method.Call(cmd, new_obj_mod, new_value)) {
      AM_POP_UP_ERROR_WINDOW("Can't execute command "
                             << cnt << ". " << cmd.Get(Am_LABEL)
                             << " on NEW objects  " << new_obj_mod
                             << " with new value " << new_value
                             << "; command object " << cmd);
      return false;
    }
    if (am_sdebug)
      std::cout << "%% " << new_method << " on " << cmd << " new_obj "
                << new_obj_mod << " val " << new_value << std::endl
                << std::flush;
    new_cmd = new_method.Call(undo_handler, cmd, new_obj_mod, new_value);
  } else { // not on new objects
    if (!same_allowed_method.Call(cmd)) {
      AM_POP_UP_ERROR_WINDOW("Can't execute command "
                             << cnt << ". " << cmd.Get(Am_LABEL)
                             << " on SAME; command object " << cmd);
      return false;
    }
    new_cmd = same_method.Call(undo_handler, cmd);
  }

  if (!find_objects_for_placeholders(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, cmd,
                                     new_cmd, sel_widget)) {
    return false;
  }
  if (Am_Beep_Happened) {
    Am_String s = am_gen_command_label(cmd);
    AM_POP_UP_ERROR_WINDOW("Quitting due to Beep from command "
                           << s << "; command object " << cmd);
    return false;
  }
  return true;
}